

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_certificate(ptls_t *tls,ptls_message_emitter_t *emitter,
                    st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
                    int push_status_request,uint16_t *compress_algos,size_t num_compress_algos)

{
  ptls_emit_certificate_t *local_50;
  ptls_emit_certificate_t *local_48;
  ptls_emit_certificate_t *emit_certificate;
  int ret;
  int push_status_request_local;
  st_ptls_signature_algorithms_t *signature_algorithms_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t context_local;
  
  if (signature_algorithms->count == 0) {
    emit_certificate._0_4_ = 0x6d;
  }
  else {
    if (tls->ctx->emit_certificate == (ptls_emit_certificate_t *)0x0) {
      local_50 = &send_certificate::default_emit_certificate;
    }
    else {
      local_50 = tls->ctx->emit_certificate;
    }
    local_48 = local_50;
    while ((emit_certificate._0_4_ =
                 (*local_48->cb)(local_48,tls,emitter,tls->key_schedule,context,push_status_request,
                                 compress_algos,num_compress_algos), (int)emit_certificate != 0 &&
           ((int)emit_certificate == 0x20a))) {
      if (local_48 == &send_certificate::default_emit_certificate) {
        __assert_fail("emit_certificate != &default_emit_certificate",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0xc66,
                      "int send_certificate(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, ptls_iovec_t, int, const uint16_t *, size_t)"
                     );
      }
      local_48 = &send_certificate::default_emit_certificate;
    }
  }
  return (int)emit_certificate;
}

Assistant:

static int send_certificate(ptls_t *tls, ptls_message_emitter_t *emitter,
                            struct st_ptls_signature_algorithms_t *signature_algorithms, ptls_iovec_t context,
                            int push_status_request, const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    { /* send Certificate (or the equivalent) */
        static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
        ptls_emit_certificate_t *emit_certificate =
            tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    Redo:
        if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request,
                                        compress_algos, num_compress_algos)) != 0) {
            if (ret == PTLS_ERROR_DELEGATE) {
                assert(emit_certificate != &default_emit_certificate);
                emit_certificate = &default_emit_certificate;
                goto Redo;
            }
            goto Exit;
        }
    }

Exit:
    return ret;
}